

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void * Curl_hash_pick(curl_hash *h,void *key,size_t key_len)

{
  curl_llist *pcVar1;
  void *pvVar2;
  size_t sVar3;
  curl_llist_element *pcVar4;
  
  if (h != (curl_hash *)0x0) {
    pcVar1 = h->table;
    sVar3 = (*h->hash_func)(key,key_len,(long)h->slots);
    pcVar4 = pcVar1[sVar3].head;
    if (pcVar4 != (curl_llist_element *)0x0) {
      do {
        pvVar2 = pcVar4->ptr;
        sVar3 = (*h->comp_func)((void *)((long)pvVar2 + 0x28),*(size_t *)((long)pvVar2 + 0x20),key,
                                key_len);
        if (sVar3 != 0) {
          return *(void **)((long)pvVar2 + 0x18);
        }
        pcVar4 = pcVar4->next;
      } while (pcVar4 != (curl_llist_element *)0x0);
      return (void *)0x0;
    }
  }
  return (void *)0x0;
}

Assistant:

void *
Curl_hash_pick(struct curl_hash *h, void *key, size_t key_len)
{
  struct curl_llist_element *le;
  struct curl_llist *l;

  if(h) {
    l = FETCH_LIST(h, key, key_len);
    for(le = l->head; le; le = le->next) {
      struct curl_hash_element *he = le->ptr;
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        return he->ptr;
      }
    }
  }

  return NULL;
}